

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3sVertexArrayTests.cpp
# Opt level: O2

int __thiscall
deqp::gles3::Stress::anon_unknown_1::SingleVertexArrayOffsetTests::init
          (SingleVertexArrayOffsetTests *this,EVP_PKEY_CTX *ctx)

{
  uint uVar1;
  Context *context;
  _Alloc_hider name;
  undefined8 in_RAX;
  TestCaseGroup *this_00;
  undefined8 extraout_RAX;
  InputType type;
  InputType type_00;
  long lVar2;
  string local_70;
  string local_50;
  
  for (lVar2 = 0; lVar2 != 8; lVar2 = lVar2 + 4) {
    this_00 = (TestCaseGroup *)operator_new(0x80);
    context = (this->super_TestCaseGroup).m_context;
    uVar1 = *(uint *)((long)&DAT_00a0b3b4 + lVar2);
    deqp::gls::Array::inputTypeToString_abi_cxx11_(&local_50,(Array *)(ulong)uVar1,type);
    name._M_p = local_50._M_dataplus._M_p;
    deqp::gls::Array::inputTypeToString_abi_cxx11_(&local_70,(Array *)(ulong)uVar1,type_00);
    TestCaseGroup::TestCaseGroup(this_00,context,name._M_p,local_70._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    (this_00->super_TestCaseGroup).super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__TestCase_00c2daf0;
    *(uint *)&this_00[1].super_TestCaseGroup.super_TestNode._vptr_TestNode = uVar1;
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_00);
    in_RAX = extraout_RAX;
  }
  return (int)in_RAX;
}

Assistant:

void SingleVertexArrayOffsetTests::init (void)
{
	// Test offset with different input types, component counts and storage, Usage(?)
	Array::InputType	inputTypes[]	= {Array::INPUTTYPE_FLOAT, Array::INPUTTYPE_INT_2_10_10_10 };

	for (int inputTypeNdx = 0; inputTypeNdx < DE_LENGTH_OF_ARRAY(inputTypes); inputTypeNdx++)
	{
		addChild(new SingleVertexArrayOffsetGroup(m_context, inputTypes[inputTypeNdx]));
	}
}